

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_f16c.cpp
# Opt level: O2

void ncnn::innerproduct_fp16s_pack8_avx_f16c
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_fp16,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  void *pvVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  float *pfVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  undefined1 (*pauVar15) [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  float fVar21;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  float fVar32;
  undefined1 auVar33 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  float fVar51;
  undefined1 auVar52 [16];
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  float fVar71;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar72 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar91 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar41 [32];
  
  iVar9 = bottom_blob->elempack * bottom_blob->w;
  pvVar3 = bias_data->data;
  uVar12 = 0;
  uVar11 = (ulong)(uint)top_blob->w;
  if (top_blob->w < 1) {
    uVar11 = uVar12;
  }
  auVar17 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar69 = ZEXT3264(CONCAT428(0x3f000000,
                               CONCAT424(0x3f000000,
                                         CONCAT420(0x3f000000,
                                                   CONCAT416(0x3f000000,
                                                             CONCAT412(0x3f000000,
                                                                       CONCAT48(0x3f000000,
                                                                                0x3f0000003f000000))
                                                            )))));
  auVar70._8_4_ = 0x3f800000;
  auVar70._0_8_ = 0x3f8000003f800000;
  auVar70._12_4_ = 0x3f800000;
  auVar70._16_4_ = 0x3f800000;
  auVar70._20_4_ = 0x3f800000;
  auVar70._24_4_ = 0x3f800000;
  auVar70._28_4_ = 0x3f800000;
  do {
    if (uVar12 == uVar11) {
      return;
    }
    fVar76 = 0.0;
    fVar77 = 0.0;
    fVar71 = 0.0;
    fVar75 = 0.0;
    fVar78 = 0.0;
    fVar79 = 0.0;
    fVar80 = 0.0;
    fVar81 = 0.0;
    fVar104 = 0.0;
    fVar105 = 0.0;
    fVar102 = 0.0;
    fVar103 = 0.0;
    fVar106 = 0.0;
    fVar107 = 0.0;
    fVar108 = 0.0;
    fVar109 = 0.0;
    if (pvVar3 != (void *)0x0) {
      pfVar10 = (float *)((long)pvVar3 + uVar12 * 0x20);
      fVar102 = *pfVar10;
      fVar103 = pfVar10[1];
      fVar104 = pfVar10[2];
      fVar105 = pfVar10[3];
      fVar106 = pfVar10[4];
      fVar107 = pfVar10[5];
      fVar108 = pfVar10[6];
      fVar109 = pfVar10[7];
    }
    pauVar15 = (undefined1 (*) [32])
               ((long)weight_data_fp16->w * uVar12 * weight_data_fp16->elemsize +
               (long)weight_data_fp16->data);
    lVar13 = 0;
    fVar112 = 0.0;
    fVar113 = 0.0;
    fVar110 = 0.0;
    fVar111 = 0.0;
    fVar114 = 0.0;
    fVar115 = 0.0;
    fVar116 = 0.0;
    fVar117 = 0.0;
    fVar26 = 0.0;
    fVar27 = 0.0;
    fVar21 = 0.0;
    fVar25 = 0.0;
    fVar28 = 0.0;
    fVar29 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar63 = 0.0;
    fVar64 = 0.0;
    fVar51 = 0.0;
    fVar62 = 0.0;
    fVar65 = 0.0;
    fVar66 = 0.0;
    fVar67 = 0.0;
    fVar68 = 0.0;
    fVar45 = 0.0;
    fVar46 = 0.0;
    fVar32 = 0.0;
    fVar44 = 0.0;
    fVar47 = 0.0;
    fVar48 = 0.0;
    fVar49 = 0.0;
    fVar50 = 0.0;
    fVar84 = 0.0;
    fVar85 = 0.0;
    fVar82 = 0.0;
    fVar83 = 0.0;
    fVar86 = 0.0;
    fVar87 = 0.0;
    fVar88 = 0.0;
    fVar89 = 0.0;
    fVar93 = 0.0;
    fVar94 = 0.0;
    fVar90 = 0.0;
    fVar92 = 0.0;
    fVar95 = 0.0;
    fVar96 = 0.0;
    fVar97 = 0.0;
    fVar98 = 0.0;
    pfVar10 = (float *)bottom_blob->data;
    for (iVar14 = 0; iVar14 + 7 < iVar9; iVar14 = iVar14 + 8) {
      auVar42 = vlddqu_avx(*pauVar15);
      fVar1 = *pfVar10;
      auVar22 = vcvtph2ps_f16c(auVar42._0_16_);
      fVar102 = fVar1 * auVar22._0_4_ + fVar102;
      fVar103 = fVar1 * auVar22._4_4_ + fVar103;
      fVar104 = fVar1 * auVar22._8_4_ + fVar104;
      fVar105 = fVar1 * auVar22._12_4_ + fVar105;
      fVar106 = fVar1 * auVar22._16_4_ + fVar106;
      fVar107 = fVar1 * auVar22._20_4_ + fVar107;
      fVar108 = fVar1 * auVar22._24_4_ + fVar108;
      fVar109 = fVar1 + fVar109;
      fVar1 = pfVar10[1];
      auVar42 = vcvtph2ps_f16c(auVar42._16_16_);
      fVar90 = fVar1 * auVar42._0_4_ + fVar90;
      fVar92 = fVar1 * auVar42._4_4_ + fVar92;
      fVar93 = fVar1 * auVar42._8_4_ + fVar93;
      fVar94 = fVar1 * auVar42._12_4_ + fVar94;
      fVar95 = fVar1 * auVar42._16_4_ + fVar95;
      fVar96 = fVar1 * auVar42._20_4_ + fVar96;
      fVar97 = fVar1 * auVar42._24_4_ + fVar97;
      fVar98 = auVar42._28_4_ + fVar98;
      auVar42 = vlddqu_avx(pauVar15[1]);
      fVar1 = pfVar10[2];
      auVar22 = vcvtph2ps_f16c(auVar42._0_16_);
      fVar82 = fVar1 * auVar22._0_4_ + fVar82;
      fVar83 = fVar1 * auVar22._4_4_ + fVar83;
      fVar84 = fVar1 * auVar22._8_4_ + fVar84;
      fVar85 = fVar1 * auVar22._12_4_ + fVar85;
      fVar86 = fVar1 * auVar22._16_4_ + fVar86;
      fVar87 = fVar1 * auVar22._20_4_ + fVar87;
      fVar88 = fVar1 * auVar22._24_4_ + fVar88;
      fVar89 = fVar1 + fVar89;
      fVar1 = pfVar10[3];
      auVar42 = vcvtph2ps_f16c(auVar42._16_16_);
      fVar32 = fVar1 * auVar42._0_4_ + fVar32;
      fVar44 = fVar1 * auVar42._4_4_ + fVar44;
      fVar45 = fVar1 * auVar42._8_4_ + fVar45;
      fVar46 = fVar1 * auVar42._12_4_ + fVar46;
      fVar47 = fVar1 * auVar42._16_4_ + fVar47;
      fVar48 = fVar1 * auVar42._20_4_ + fVar48;
      fVar49 = fVar1 * auVar42._24_4_ + fVar49;
      fVar50 = auVar42._28_4_ + fVar50;
      auVar42 = vlddqu_avx(pauVar15[2]);
      fVar1 = pfVar10[4];
      auVar22 = vcvtph2ps_f16c(auVar42._0_16_);
      fVar51 = fVar1 * auVar22._0_4_ + fVar51;
      fVar62 = fVar1 * auVar22._4_4_ + fVar62;
      fVar63 = fVar1 * auVar22._8_4_ + fVar63;
      fVar64 = fVar1 * auVar22._12_4_ + fVar64;
      fVar65 = fVar1 * auVar22._16_4_ + fVar65;
      fVar66 = fVar1 * auVar22._20_4_ + fVar66;
      fVar67 = fVar1 * auVar22._24_4_ + fVar67;
      fVar68 = fVar1 + fVar68;
      fVar1 = pfVar10[5];
      auVar42 = vcvtph2ps_f16c(auVar42._16_16_);
      fVar21 = fVar1 * auVar42._0_4_ + fVar21;
      fVar25 = fVar1 * auVar42._4_4_ + fVar25;
      fVar26 = fVar1 * auVar42._8_4_ + fVar26;
      fVar27 = fVar1 * auVar42._12_4_ + fVar27;
      fVar28 = fVar1 * auVar42._16_4_ + fVar28;
      fVar29 = fVar1 * auVar42._20_4_ + fVar29;
      fVar30 = fVar1 * auVar42._24_4_ + fVar30;
      fVar31 = auVar42._28_4_ + fVar31;
      auVar42 = vlddqu_avx(pauVar15[3]);
      fVar1 = pfVar10[6];
      auVar22 = vcvtph2ps_f16c(auVar42._0_16_);
      fVar110 = fVar1 * auVar22._0_4_ + fVar110;
      fVar111 = fVar1 * auVar22._4_4_ + fVar111;
      fVar112 = fVar1 * auVar22._8_4_ + fVar112;
      fVar113 = fVar1 * auVar22._12_4_ + fVar113;
      fVar114 = fVar1 * auVar22._16_4_ + fVar114;
      fVar115 = fVar1 * auVar22._20_4_ + fVar115;
      fVar116 = fVar1 * auVar22._24_4_ + fVar116;
      fVar117 = fVar1 + fVar117;
      fVar1 = pfVar10[7];
      auVar42 = vcvtph2ps_f16c(auVar42._16_16_);
      fVar71 = fVar1 * auVar42._0_4_ + fVar71;
      fVar75 = fVar1 * auVar42._4_4_ + fVar75;
      fVar76 = fVar1 * auVar42._8_4_ + fVar76;
      fVar77 = fVar1 * auVar42._12_4_ + fVar77;
      fVar78 = fVar1 * auVar42._16_4_ + fVar78;
      fVar79 = fVar1 * auVar42._20_4_ + fVar79;
      fVar80 = fVar1 * auVar42._24_4_ + fVar80;
      fVar81 = auVar42._28_4_ + fVar81;
      pfVar10 = pfVar10 + 8;
      pauVar15 = pauVar15 + 4;
      lVar13 = lVar13 + 8;
    }
    for (; iVar14 + 3 < iVar9; iVar14 = iVar14 + 4) {
      auVar42 = vlddqu_avx(*pauVar15);
      fVar1 = *pfVar10;
      auVar22 = vcvtph2ps_f16c(auVar42._0_16_);
      fVar102 = fVar1 * auVar22._0_4_ + fVar102;
      fVar103 = fVar1 * auVar22._4_4_ + fVar103;
      fVar104 = fVar1 * auVar22._8_4_ + fVar104;
      fVar105 = fVar1 * auVar22._12_4_ + fVar105;
      fVar106 = fVar1 * auVar22._16_4_ + fVar106;
      fVar107 = fVar1 * auVar22._20_4_ + fVar107;
      fVar108 = fVar1 * auVar22._24_4_ + fVar108;
      fVar109 = fVar1 + fVar109;
      fVar1 = pfVar10[1];
      auVar42 = vcvtph2ps_f16c(auVar42._16_16_);
      fVar90 = fVar1 * auVar42._0_4_ + fVar90;
      fVar92 = fVar1 * auVar42._4_4_ + fVar92;
      fVar93 = fVar1 * auVar42._8_4_ + fVar93;
      fVar94 = fVar1 * auVar42._12_4_ + fVar94;
      fVar95 = fVar1 * auVar42._16_4_ + fVar95;
      fVar96 = fVar1 * auVar42._20_4_ + fVar96;
      fVar97 = fVar1 * auVar42._24_4_ + fVar97;
      fVar98 = auVar42._28_4_ + fVar98;
      auVar42 = vlddqu_avx(pauVar15[1]);
      fVar1 = pfVar10[2];
      auVar22 = vcvtph2ps_f16c(auVar42._0_16_);
      fVar82 = fVar1 * auVar22._0_4_ + fVar82;
      fVar83 = fVar1 * auVar22._4_4_ + fVar83;
      fVar84 = fVar1 * auVar22._8_4_ + fVar84;
      fVar85 = fVar1 * auVar22._12_4_ + fVar85;
      fVar86 = fVar1 * auVar22._16_4_ + fVar86;
      fVar87 = fVar1 * auVar22._20_4_ + fVar87;
      fVar88 = fVar1 * auVar22._24_4_ + fVar88;
      fVar89 = fVar1 + fVar89;
      fVar1 = pfVar10[3];
      auVar42 = vcvtph2ps_f16c(auVar42._16_16_);
      fVar32 = fVar1 * auVar42._0_4_ + fVar32;
      fVar44 = fVar1 * auVar42._4_4_ + fVar44;
      fVar45 = fVar1 * auVar42._8_4_ + fVar45;
      fVar46 = fVar1 * auVar42._12_4_ + fVar46;
      fVar47 = fVar1 * auVar42._16_4_ + fVar47;
      fVar48 = fVar1 * auVar42._20_4_ + fVar48;
      fVar49 = fVar1 * auVar42._24_4_ + fVar49;
      fVar50 = auVar42._28_4_ + fVar50;
      pfVar10 = pfVar10 + 4;
      pauVar15 = pauVar15 + 2;
      lVar13 = lVar13 + 4;
    }
    for (; (int)lVar13 < iVar9; lVar13 = lVar13 + 1) {
      fVar1 = *(float *)((long)bottom_blob->data + lVar13 * 4);
      auVar52 = vlddqu_avx(*(undefined1 (*) [16])*pauVar15);
      auVar42 = vcvtph2ps_f16c(auVar52);
      fVar102 = fVar1 * auVar42._0_4_ + fVar102;
      fVar103 = fVar1 * auVar42._4_4_ + fVar103;
      fVar104 = fVar1 * auVar42._8_4_ + fVar104;
      fVar105 = fVar1 * auVar42._12_4_ + fVar105;
      fVar106 = fVar1 * auVar42._16_4_ + fVar106;
      fVar107 = fVar1 * auVar42._20_4_ + fVar107;
      fVar108 = fVar1 * auVar42._24_4_ + fVar108;
      fVar109 = fVar1 + fVar109;
      pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
    }
    fVar102 = fVar102 + fVar110 + fVar71 + fVar21 + fVar51 + fVar90 + fVar82 + fVar32;
    fVar103 = fVar103 + fVar111 + fVar75 + fVar25 + fVar62 + fVar92 + fVar83 + fVar44;
    auVar22._0_8_ = CONCAT44(fVar103,fVar102);
    auVar22._8_4_ = fVar104 + fVar112 + fVar76 + fVar26 + fVar63 + fVar93 + fVar84 + fVar45;
    auVar22._12_4_ = fVar105 + fVar113 + fVar77 + fVar27 + fVar64 + fVar94 + fVar85 + fVar46;
    auVar22._16_4_ = fVar106 + fVar114 + fVar78 + fVar28 + fVar65 + fVar95 + fVar86 + fVar47;
    auVar22._20_4_ = fVar107 + fVar115 + fVar79 + fVar29 + fVar66 + fVar96 + fVar87 + fVar48;
    auVar22._24_4_ = fVar108 + fVar116 + fVar80 + fVar30 + fVar67 + fVar97 + fVar88 + fVar49;
    auVar22._28_4_ = fVar109 + fVar117 + fVar81 + fVar31 + fVar68 + fVar98 + fVar89 + fVar50;
    auVar42 = auVar22;
    if (5 < activation_type - 1U) goto switchD_002fd811_caseD_1;
    auVar16 = auVar17._0_32_;
    auVar42 = vmaxps_avx(auVar22,auVar16);
    fVar76 = auVar69._0_4_;
    fVar77 = auVar69._4_4_;
    fVar104 = auVar69._8_4_;
    fVar105 = auVar69._12_4_;
    fVar106 = auVar69._16_4_;
    fVar107 = auVar69._20_4_;
    fVar108 = auVar69._24_4_;
    fVar109 = auVar69._28_4_;
    switch(activation_type) {
    case 2:
      auVar22 = vminps_avx(auVar22,auVar16);
      fVar76 = *activation_params->data;
      auVar34._0_4_ = fVar76 * auVar22._0_4_ + auVar42._0_4_;
      auVar34._4_4_ = fVar76 * auVar22._4_4_ + auVar42._4_4_;
      auVar34._8_4_ = fVar76 * auVar22._8_4_ + auVar42._8_4_;
      auVar34._12_4_ = fVar76 * auVar22._12_4_ + auVar42._12_4_;
      auVar34._16_4_ = fVar76 * auVar22._16_4_ + auVar42._16_4_;
      auVar34._20_4_ = fVar76 * auVar22._20_4_ + auVar42._20_4_;
      auVar34._24_4_ = fVar76 * auVar22._24_4_ + auVar42._24_4_;
      auVar34._28_4_ = auVar22._28_4_ + auVar42._28_4_;
      auVar42 = auVar34;
      break;
    case 3:
      uVar2 = *activation_params->data;
      auVar37._4_4_ = uVar2;
      auVar37._0_4_ = uVar2;
      auVar37._8_4_ = uVar2;
      auVar37._12_4_ = uVar2;
      auVar37._16_4_ = uVar2;
      auVar37._20_4_ = uVar2;
      auVar37._24_4_ = uVar2;
      auVar37._28_4_ = uVar2;
      uVar2 = *(undefined4 *)((long)activation_params->data + 4);
      auVar61._4_4_ = uVar2;
      auVar61._0_4_ = uVar2;
      auVar61._8_4_ = uVar2;
      auVar61._12_4_ = uVar2;
      auVar61._16_4_ = uVar2;
      auVar61._20_4_ = uVar2;
      auVar61._24_4_ = uVar2;
      auVar61._28_4_ = uVar2;
      auVar42 = vmaxps_avx(auVar22,auVar37);
      auVar42 = vminps_avx(auVar42,auVar61);
      break;
    case 4:
      auVar23._0_8_ = auVar22._0_8_ ^ 0x8000000080000000;
      auVar23._8_4_ = -auVar22._8_4_;
      auVar23._12_4_ = -auVar22._12_4_;
      auVar23._16_4_ = -auVar22._16_4_;
      auVar23._20_4_ = -auVar22._20_4_;
      auVar23._24_4_ = -auVar22._24_4_;
      auVar23._28_4_ = -auVar22._28_4_;
      auVar38._8_4_ = 0x42b0c0a5;
      auVar38._0_8_ = 0x42b0c0a542b0c0a5;
      auVar38._12_4_ = 0x42b0c0a5;
      auVar38._16_4_ = 0x42b0c0a5;
      auVar38._20_4_ = 0x42b0c0a5;
      auVar38._24_4_ = 0x42b0c0a5;
      auVar38._28_4_ = 0x42b0c0a5;
      auVar42 = vminps_avx(auVar23,auVar38);
      auVar39._8_4_ = 0xc2b0c0a5;
      auVar39._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar39._12_4_ = 0xc2b0c0a5;
      auVar39._16_4_ = 0xc2b0c0a5;
      auVar39._20_4_ = 0xc2b0c0a5;
      auVar39._24_4_ = 0xc2b0c0a5;
      auVar39._28_4_ = 0xc2b0c0a5;
      auVar22 = vmaxps_avx(auVar42,auVar39);
      auVar40._0_4_ = auVar22._0_4_ * 1.442695 + fVar76;
      auVar40._4_4_ = auVar22._4_4_ * 1.442695 + fVar77;
      auVar40._8_4_ = auVar22._8_4_ * 1.442695 + fVar104;
      auVar40._12_4_ = auVar22._12_4_ * 1.442695 + fVar105;
      auVar40._16_4_ = auVar22._16_4_ * 1.442695 + fVar106;
      auVar40._20_4_ = auVar22._20_4_ * 1.442695 + fVar107;
      auVar40._24_4_ = auVar22._24_4_ * 1.442695 + fVar108;
      auVar40._28_4_ = fVar109 + 1.442695;
      auVar16 = vroundps_avx(auVar40,1);
      auVar42 = vcmpps_avx(auVar40,auVar16,1);
      auVar42 = vandps_avx(auVar42,auVar70);
      auVar42 = vsubps_avx(auVar16,auVar42);
      fVar102 = auVar22._0_4_ + auVar42._0_4_ * -0.6931472;
      fVar103 = auVar22._4_4_ + auVar42._4_4_ * -0.6931472;
      fVar109 = auVar22._8_4_ + auVar42._8_4_ * -0.6931472;
      fVar71 = auVar22._12_4_ + auVar42._12_4_ * -0.6931472;
      fVar75 = auVar22._16_4_ + auVar42._16_4_ * -0.6931472;
      fVar78 = auVar22._20_4_ + auVar42._20_4_ * -0.6931472;
      fVar79 = auVar22._24_4_ + auVar42._24_4_ * -0.6931472;
      auVar33._0_4_ = (int)auVar42._0_4_;
      auVar33._4_4_ = (int)auVar42._4_4_;
      auVar33._8_4_ = (int)auVar42._8_4_;
      auVar33._12_4_ = (int)auVar42._12_4_;
      auVar41._16_4_ = (int)auVar42._16_4_;
      auVar41._0_16_ = auVar33;
      auVar41._20_4_ = (int)auVar42._20_4_;
      auVar41._24_4_ = (int)auVar42._24_4_;
      auVar41._28_4_ = (int)auVar42._28_4_;
      auVar72 = vpslld_avx(auVar33,0x17);
      auVar52 = vpslld_avx(auVar41._16_16_,0x17);
      auVar19._8_4_ = 0x3f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      auVar19._12_4_ = 0x3f800000;
      auVar52 = vpaddd_avx(auVar52,auVar19);
      auVar72 = vpaddd_avx(auVar72,auVar19);
      auVar24._0_4_ =
           (fVar102 + 1.0 +
           fVar102 * fVar102 *
           (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
             0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar76)) * auVar72._0_4_ + 1.0;
      auVar24._4_4_ =
           (fVar103 + 1.0 +
           fVar103 * fVar103 *
           (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
             0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar77)) * auVar72._4_4_ + 1.0;
      auVar24._8_4_ =
           (fVar109 + 1.0 +
           fVar109 * fVar109 *
           (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
             0.041665796) * fVar109 + 0.16666666) * fVar109 + fVar104)) * auVar72._8_4_ + 1.0;
      auVar24._12_4_ =
           (fVar71 + 1.0 +
           fVar71 * fVar71 *
           (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71 +
             0.041665796) * fVar71 + 0.16666666) * fVar71 + fVar105)) * auVar72._12_4_ + 1.0;
      auVar24._16_4_ =
           (fVar75 + 1.0 +
           fVar75 * fVar75 *
           (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
             0.041665796) * fVar75 + 0.16666666) * fVar75 + fVar106)) * auVar52._0_4_ + 1.0;
      auVar24._20_4_ =
           (fVar78 + 1.0 +
           fVar78 * fVar78 *
           (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
             0.041665796) * fVar78 + 0.16666666) * fVar78 + fVar107)) * auVar52._4_4_ + 1.0;
      auVar24._24_4_ =
           (fVar79 + 1.0 +
           fVar79 * fVar79 *
           (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
             0.041665796) * fVar79 + 0.16666666) * fVar79 + fVar108)) * auVar52._8_4_ + 1.0;
      auVar24._28_4_ = auVar22._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
      auVar22 = vrcpps_avx(auVar24);
      fVar76 = auVar22._0_4_;
      fVar77 = auVar22._4_4_;
      auVar8._4_4_ = auVar24._4_4_ * fVar77;
      auVar8._0_4_ = auVar24._0_4_ * fVar76;
      fVar102 = auVar22._8_4_;
      auVar8._8_4_ = auVar24._8_4_ * fVar102;
      fVar103 = auVar22._12_4_;
      auVar8._12_4_ = auVar24._12_4_ * fVar103;
      fVar104 = auVar22._16_4_;
      auVar8._16_4_ = auVar24._16_4_ * fVar104;
      fVar105 = auVar22._20_4_;
      auVar8._20_4_ = auVar24._20_4_ * fVar105;
      fVar106 = auVar22._24_4_;
      auVar8._24_4_ = auVar24._24_4_ * fVar106;
      auVar8._28_4_ = auVar24._28_4_;
      auVar16 = vsubps_avx(auVar70,auVar8);
      auVar42._0_4_ = fVar76 + fVar76 * auVar16._0_4_;
      auVar42._4_4_ = fVar77 + fVar77 * auVar16._4_4_;
      auVar42._8_4_ = fVar102 + fVar102 * auVar16._8_4_;
      auVar42._12_4_ = fVar103 + fVar103 * auVar16._12_4_;
      auVar42._16_4_ = fVar104 + fVar104 * auVar16._16_4_;
      auVar42._20_4_ = fVar105 + fVar105 * auVar16._20_4_;
      auVar42._24_4_ = fVar106 + fVar106 * auVar16._24_4_;
      auVar42._28_4_ = auVar22._28_4_ + auVar16._28_4_;
      break;
    case 5:
      auVar100._8_4_ = 0x42b0c0a5;
      auVar100._0_8_ = 0x42b0c0a542b0c0a5;
      auVar100._12_4_ = 0x42b0c0a5;
      auVar100._16_4_ = 0x42b0c0a5;
      auVar100._20_4_ = 0x42b0c0a5;
      auVar100._24_4_ = 0x42b0c0a5;
      auVar100._28_4_ = 0x42b0c0a5;
      auVar42 = vminps_avx(auVar100,auVar22);
      auVar101._8_4_ = 0xc2b0c0a5;
      auVar101._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar101._12_4_ = 0xc2b0c0a5;
      auVar101._16_4_ = 0xc2b0c0a5;
      auVar101._20_4_ = 0xc2b0c0a5;
      auVar101._24_4_ = 0xc2b0c0a5;
      auVar101._28_4_ = 0xc2b0c0a5;
      auVar16 = vmaxps_avx(auVar101,auVar42);
      auVar53._0_4_ = auVar16._0_4_ * 1.442695 + fVar76;
      auVar53._4_4_ = auVar16._4_4_ * 1.442695 + fVar77;
      auVar53._8_4_ = auVar16._8_4_ * 1.442695 + fVar104;
      auVar53._12_4_ = auVar16._12_4_ * 1.442695 + fVar105;
      auVar53._16_4_ = auVar16._16_4_ * 1.442695 + fVar106;
      auVar53._20_4_ = auVar16._20_4_ * 1.442695 + fVar107;
      auVar53._24_4_ = auVar16._24_4_ * 1.442695 + fVar108;
      auVar53._28_4_ = fVar68 + fVar109;
      auVar43 = vroundps_avx(auVar53,1);
      auVar42 = vcmpps_avx(auVar53,auVar43,1);
      auVar42 = vandps_avx(auVar42,auVar70);
      auVar42 = vsubps_avx(auVar43,auVar42);
      auVar4._4_4_ = auVar42._4_4_ * 0.6931472;
      auVar4._0_4_ = auVar42._0_4_ * 0.6931472;
      auVar4._8_4_ = auVar42._8_4_ * 0.6931472;
      auVar4._12_4_ = auVar42._12_4_ * 0.6931472;
      auVar4._16_4_ = auVar42._16_4_ * 0.6931472;
      auVar4._20_4_ = auVar42._20_4_ * 0.6931472;
      auVar4._24_4_ = auVar42._24_4_ * 0.6931472;
      auVar4._28_4_ = auVar43._28_4_;
      auVar16 = vsubps_avx(auVar16,auVar4);
      fVar71 = auVar16._0_4_;
      fVar75 = auVar16._4_4_;
      fVar78 = auVar16._8_4_;
      fVar79 = auVar16._12_4_;
      fVar80 = auVar16._16_4_;
      fVar81 = auVar16._20_4_;
      fVar26 = auVar16._24_4_;
      auVar52._0_4_ = (int)auVar42._0_4_;
      auVar52._4_4_ = (int)auVar42._4_4_;
      auVar52._8_4_ = (int)auVar42._8_4_;
      auVar52._12_4_ = (int)auVar42._12_4_;
      auVar54._16_4_ = (int)auVar42._16_4_;
      auVar54._0_16_ = auVar52;
      auVar54._20_4_ = (int)auVar42._20_4_;
      auVar54._24_4_ = (int)auVar42._24_4_;
      auVar54._28_4_ = (int)auVar42._28_4_;
      auVar72 = vpslld_avx(auVar52,0x17);
      auVar52 = vpslld_avx(auVar54._16_16_,0x17);
      auVar18._8_4_ = 0x3f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._12_4_ = 0x3f800000;
      auVar52 = vpaddd_avx(auVar52,auVar18);
      auVar72 = vpaddd_avx(auVar72,auVar18);
      auVar35._0_4_ =
           (fVar71 + 1.0 +
           (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71 +
             0.041665796) * fVar71 + 0.16666666) * fVar71 + fVar76) * fVar71 * fVar71) *
           auVar72._0_4_ + 1.0;
      auVar35._4_4_ =
           (fVar75 + 1.0 +
           (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
             0.041665796) * fVar75 + 0.16666666) * fVar75 + fVar77) * fVar75 * fVar75) *
           auVar72._4_4_ + 1.0;
      auVar35._8_4_ =
           (fVar78 + 1.0 +
           (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
             0.041665796) * fVar78 + 0.16666666) * fVar78 + fVar104) * fVar78 * fVar78) *
           auVar72._8_4_ + 1.0;
      auVar35._12_4_ =
           (fVar79 + 1.0 +
           (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
             0.041665796) * fVar79 + 0.16666666) * fVar79 + fVar105) * fVar79 * fVar79) *
           auVar72._12_4_ + 1.0;
      auVar35._16_4_ =
           (fVar80 + 1.0 +
           (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) * fVar80 +
             0.041665796) * fVar80 + 0.16666666) * fVar80 + fVar106) * fVar80 * fVar80) *
           auVar52._0_4_ + 1.0;
      auVar35._20_4_ =
           (fVar81 + 1.0 +
           (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
             0.041665796) * fVar81 + 0.16666666) * fVar81 + fVar107) * fVar81 * fVar81) *
           auVar52._4_4_ + 1.0;
      auVar35._24_4_ =
           (fVar26 + 1.0 +
           (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
             0.041665796) * fVar26 + 0.16666666) * fVar26 + fVar108) * fVar26 * fVar26) *
           auVar52._8_4_ + 1.0;
      auVar35._28_4_ = auVar16._28_4_ + 1.0 + auVar43._28_4_ + 1.0;
      auVar55._8_4_ = 0x800000;
      auVar55._0_8_ = 0x80000000800000;
      auVar55._12_4_ = 0x800000;
      auVar55._16_4_ = 0x800000;
      auVar55._20_4_ = 0x800000;
      auVar55._24_4_ = 0x800000;
      auVar55._28_4_ = 0x800000;
      auVar43 = vmaxps_avx(auVar35,auVar55);
      auVar52 = vpsrld_avx(auVar43._16_16_,0x17);
      auVar56._8_4_ = 0x807fffff;
      auVar56._0_8_ = 0x807fffff807fffff;
      auVar56._12_4_ = 0x807fffff;
      auVar56._16_4_ = 0x807fffff;
      auVar56._20_4_ = 0x807fffff;
      auVar56._24_4_ = 0x807fffff;
      auVar56._28_4_ = 0x807fffff;
      auVar42 = vandps_avx(auVar43,auVar56);
      auVar4 = vorps_avx(auVar42,auVar69._0_32_);
      auVar91._8_4_ = 0x3f3504f3;
      auVar91._0_8_ = 0x3f3504f33f3504f3;
      auVar91._12_4_ = 0x3f3504f3;
      auVar91._16_4_ = 0x3f3504f3;
      auVar91._20_4_ = 0x3f3504f3;
      auVar91._24_4_ = 0x3f3504f3;
      auVar91._28_4_ = 0x3f3504f3;
      auVar16 = vcmpps_avx(auVar91,auVar4,2);
      auVar42 = vandnps_avx(auVar16,auVar4);
      fVar71 = auVar42._0_4_ + auVar4._0_4_ + -1.0;
      fVar75 = auVar42._4_4_ + auVar4._4_4_ + -1.0;
      fVar78 = auVar42._8_4_ + auVar4._8_4_ + -1.0;
      fVar79 = auVar42._12_4_ + auVar4._12_4_ + -1.0;
      fVar80 = auVar42._16_4_ + auVar4._16_4_ + -1.0;
      fVar81 = auVar42._20_4_ + auVar4._20_4_ + -1.0;
      fVar26 = auVar42._24_4_ + auVar4._24_4_ + -1.0;
      auVar52 = vpsubd_avx(auVar52,auVar16._16_16_);
      auVar72 = vpsrld_avx(auVar43._0_16_,0x17);
      auVar99._8_4_ = 0xffffff81;
      auVar99._0_8_ = 0xffffff81ffffff81;
      auVar99._12_4_ = 0xffffff81;
      auVar52 = vpaddd_avx(auVar52,auVar99);
      auVar72 = vpsubd_avx(auVar72,auVar16._0_16_);
      auVar72 = vpaddd_avx(auVar99,auVar72);
      auVar73._16_16_ = auVar52;
      auVar73._0_16_ = auVar72;
      auVar16 = vcmpps_avx(auVar35,_DAT_004c9a60,2);
      auVar43 = vcvtdq2ps_avx(auVar73);
      auVar5._4_4_ = (fVar75 * fVar75 *
                      (((((((((fVar75 * 0.070376836 + -0.1151461) * fVar75 + 0.116769984) * fVar75 +
                            -0.12420141) * fVar75 + 0.14249323) * fVar75 + -0.16668057) * fVar75 +
                         0.20000714) * fVar75 + -0.24999994) * fVar75 + 0.3333333) * fVar75 + -0.5)
                     + auVar43._4_4_ * 0.6931472 + fVar75) * -2.0;
      auVar5._0_4_ = (fVar71 * fVar71 *
                      (((((((((fVar71 * 0.070376836 + -0.1151461) * fVar71 + 0.116769984) * fVar71 +
                            -0.12420141) * fVar71 + 0.14249323) * fVar71 + -0.16668057) * fVar71 +
                         0.20000714) * fVar71 + -0.24999994) * fVar71 + 0.3333333) * fVar71 + -0.5)
                     + auVar43._0_4_ * 0.6931472 + fVar71) * -2.0;
      auVar5._8_4_ = (fVar78 * fVar78 *
                      (((((((((fVar78 * 0.070376836 + -0.1151461) * fVar78 + 0.116769984) * fVar78 +
                            -0.12420141) * fVar78 + 0.14249323) * fVar78 + -0.16668057) * fVar78 +
                         0.20000714) * fVar78 + -0.24999994) * fVar78 + 0.3333333) * fVar78 + -0.5)
                     + auVar43._8_4_ * 0.6931472 + fVar78) * -2.0;
      auVar5._12_4_ =
           (fVar79 * fVar79 *
            (((((((((fVar79 * 0.070376836 + -0.1151461) * fVar79 + 0.116769984) * fVar79 +
                  -0.12420141) * fVar79 + 0.14249323) * fVar79 + -0.16668057) * fVar79 + 0.20000714)
               * fVar79 + -0.24999994) * fVar79 + 0.3333333) * fVar79 + -0.5) +
           auVar43._12_4_ * 0.6931472 + fVar79) * -2.0;
      auVar5._16_4_ =
           (fVar80 * fVar80 *
            (((((((((fVar80 * 0.070376836 + -0.1151461) * fVar80 + 0.116769984) * fVar80 +
                  -0.12420141) * fVar80 + 0.14249323) * fVar80 + -0.16668057) * fVar80 + 0.20000714)
               * fVar80 + -0.24999994) * fVar80 + 0.3333333) * fVar80 + -0.5) +
           auVar43._16_4_ * 0.6931472 + fVar80) * -2.0;
      auVar5._20_4_ =
           (fVar81 * fVar81 *
            (((((((((fVar81 * 0.070376836 + -0.1151461) * fVar81 + 0.116769984) * fVar81 +
                  -0.12420141) * fVar81 + 0.14249323) * fVar81 + -0.16668057) * fVar81 + 0.20000714)
               * fVar81 + -0.24999994) * fVar81 + 0.3333333) * fVar81 + -0.5) +
           auVar43._20_4_ * 0.6931472 + fVar81) * -2.0;
      auVar5._24_4_ =
           (fVar26 * fVar26 *
            (((((((((fVar26 * 0.070376836 + -0.1151461) * fVar26 + 0.116769984) * fVar26 +
                  -0.12420141) * fVar26 + 0.14249323) * fVar26 + -0.16668057) * fVar26 + 0.20000714)
               * fVar26 + -0.24999994) * fVar26 + 0.3333333) * fVar26 + -0.5) +
           auVar43._24_4_ * 0.6931472 + fVar26) * -2.0;
      auVar5._28_4_ = auVar43._28_4_ + auVar42._28_4_ + auVar4._28_4_ + -1.0 + 0.0;
      auVar74._8_4_ = 0x7fffffff;
      auVar74._0_8_ = 0x7fffffff7fffffff;
      auVar74._12_4_ = 0x7fffffff;
      auVar74._16_4_ = 0x7fffffff;
      auVar74._20_4_ = 0x7fffffff;
      auVar74._24_4_ = 0x7fffffff;
      auVar74._28_4_ = 0x7fffffff;
      auVar42 = vblendvps_avx(auVar5,auVar74,auVar16);
      auVar57._8_4_ = 0x42b0c0a5;
      auVar57._0_8_ = 0x42b0c0a542b0c0a5;
      auVar57._12_4_ = 0x42b0c0a5;
      auVar57._16_4_ = 0x42b0c0a5;
      auVar57._20_4_ = 0x42b0c0a5;
      auVar57._24_4_ = 0x42b0c0a5;
      auVar57._28_4_ = 0x42b0c0a5;
      auVar42 = vminps_avx(auVar42,auVar57);
      auVar58._8_4_ = 0xc2b0c0a5;
      auVar58._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar58._12_4_ = 0xc2b0c0a5;
      auVar58._16_4_ = 0xc2b0c0a5;
      auVar58._20_4_ = 0xc2b0c0a5;
      auVar58._24_4_ = 0xc2b0c0a5;
      auVar58._28_4_ = 0xc2b0c0a5;
      auVar16 = vmaxps_avx(auVar42,auVar58);
      auVar59._0_4_ = auVar16._0_4_ * 1.442695 + fVar76;
      auVar59._4_4_ = auVar16._4_4_ * 1.442695 + fVar77;
      auVar59._8_4_ = auVar16._8_4_ * 1.442695 + fVar104;
      auVar59._12_4_ = auVar16._12_4_ * 1.442695 + fVar105;
      auVar59._16_4_ = auVar16._16_4_ * 1.442695 + fVar106;
      auVar59._20_4_ = auVar16._20_4_ * 1.442695 + fVar107;
      auVar59._24_4_ = auVar16._24_4_ * 1.442695 + fVar108;
      auVar59._28_4_ = fVar109 + -88.37626;
      auVar43 = vroundps_avx(auVar59,1);
      auVar42 = vcmpps_avx(auVar59,auVar43,1);
      auVar42 = vandps_avx(auVar42,auVar70);
      auVar42 = vsubps_avx(auVar43,auVar42);
      auVar6._4_4_ = auVar42._4_4_ * 0.6931472;
      auVar6._0_4_ = auVar42._0_4_ * 0.6931472;
      auVar6._8_4_ = auVar42._8_4_ * 0.6931472;
      auVar6._12_4_ = auVar42._12_4_ * 0.6931472;
      auVar6._16_4_ = auVar42._16_4_ * 0.6931472;
      auVar6._20_4_ = auVar42._20_4_ * 0.6931472;
      auVar6._24_4_ = auVar42._24_4_ * 0.6931472;
      auVar6._28_4_ = auVar43._28_4_;
      auVar16 = vsubps_avx(auVar16,auVar6);
      fVar109 = auVar16._0_4_;
      fVar71 = auVar16._4_4_;
      fVar75 = auVar16._8_4_;
      fVar78 = auVar16._12_4_;
      fVar79 = auVar16._16_4_;
      fVar80 = auVar16._20_4_;
      fVar81 = auVar16._24_4_;
      auVar69 = ZEXT3264(auVar69._0_32_);
      auVar17 = ZEXT864(0) << 0x20;
      auVar72._0_4_ = (int)auVar42._0_4_;
      auVar72._4_4_ = (int)auVar42._4_4_;
      auVar72._8_4_ = (int)auVar42._8_4_;
      auVar72._12_4_ = (int)auVar42._12_4_;
      auVar60._16_4_ = (int)auVar42._16_4_;
      auVar60._0_16_ = auVar72;
      auVar60._20_4_ = (int)auVar42._20_4_;
      auVar60._24_4_ = (int)auVar42._24_4_;
      auVar60._28_4_ = (int)auVar42._28_4_;
      auVar72 = vpslld_avx(auVar72,0x17);
      auVar52 = vpslld_avx(auVar60._16_16_,0x17);
      auVar52 = vpaddd_avx(auVar52,auVar18);
      auVar72 = vpaddd_avx(auVar72,auVar18);
      auVar36._0_4_ =
           (fVar109 + 1.0 +
           (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
             0.041665796) * fVar109 + 0.16666666) * fVar109 + fVar76) * fVar109 * fVar109) *
           auVar72._0_4_ + 1.0;
      auVar36._4_4_ =
           (fVar71 + 1.0 +
           (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71 +
             0.041665796) * fVar71 + 0.16666666) * fVar71 + fVar77) * fVar71 * fVar71) *
           auVar72._4_4_ + 1.0;
      auVar36._8_4_ =
           (fVar75 + 1.0 +
           (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
             0.041665796) * fVar75 + 0.16666666) * fVar75 + fVar104) * fVar75 * fVar75) *
           auVar72._8_4_ + 1.0;
      auVar36._12_4_ =
           (fVar78 + 1.0 +
           (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
             0.041665796) * fVar78 + 0.16666666) * fVar78 + fVar105) * fVar78 * fVar78) *
           auVar72._12_4_ + 1.0;
      auVar36._16_4_ =
           (fVar79 + 1.0 +
           (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
             0.041665796) * fVar79 + 0.16666666) * fVar79 + fVar106) * fVar79 * fVar79) *
           auVar52._0_4_ + 1.0;
      auVar36._20_4_ =
           (fVar80 + 1.0 +
           (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) * fVar80 +
             0.041665796) * fVar80 + 0.16666666) * fVar80 + fVar107) * fVar80 * fVar80) *
           auVar52._4_4_ + 1.0;
      auVar36._24_4_ =
           (fVar81 + 1.0 +
           (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
             0.041665796) * fVar81 + 0.16666666) * fVar81 + fVar108) * fVar81 * fVar81) *
           auVar52._8_4_ + 1.0;
      auVar36._28_4_ = auVar16._28_4_ + 1.0 + auVar43._28_4_ + 1.0;
      auVar42 = vrcpps_avx(auVar36);
      fVar76 = auVar42._0_4_;
      fVar77 = auVar42._4_4_;
      fVar104 = auVar42._8_4_;
      fVar105 = auVar42._12_4_;
      fVar106 = auVar42._16_4_;
      fVar107 = auVar42._20_4_;
      fVar108 = auVar42._24_4_;
      auVar7._4_4_ = auVar36._4_4_ * (fVar77 + fVar77);
      auVar7._0_4_ = auVar36._0_4_ * (fVar76 + fVar76);
      auVar7._8_4_ = auVar36._8_4_ * (fVar104 + fVar104);
      auVar7._12_4_ = auVar36._12_4_ * (fVar105 + fVar105);
      auVar7._16_4_ = auVar36._16_4_ * (fVar106 + fVar106);
      auVar7._20_4_ = auVar36._20_4_ * (fVar107 + fVar107);
      auVar7._24_4_ = auVar36._24_4_ * (fVar108 + fVar108);
      auVar7._28_4_ = auVar36._28_4_;
      auVar20._8_4_ = 0x40000000;
      auVar20._0_8_ = 0x4000000040000000;
      auVar20._12_4_ = 0x40000000;
      auVar20._16_4_ = 0x40000000;
      auVar20._20_4_ = 0x40000000;
      auVar20._24_4_ = 0x40000000;
      auVar20._28_4_ = 0x40000000;
      auVar43 = vsubps_avx(auVar20,auVar7);
      auVar16._0_4_ = fVar76 + fVar76 + -1.0 + fVar76 * auVar43._0_4_;
      auVar16._4_4_ = fVar77 + fVar77 + -1.0 + fVar77 * auVar43._4_4_;
      auVar16._8_4_ = fVar104 + fVar104 + -1.0 + fVar104 * auVar43._8_4_;
      auVar16._12_4_ = fVar105 + fVar105 + -1.0 + fVar105 * auVar43._12_4_;
      auVar16._16_4_ = fVar106 + fVar106 + -1.0 + fVar106 * auVar43._16_4_;
      auVar16._20_4_ = fVar107 + fVar107 + -1.0 + fVar107 * auVar43._20_4_;
      auVar16._24_4_ = fVar108 + fVar108 + -1.0 + fVar108 * auVar43._24_4_;
      auVar16._28_4_ = auVar42._28_4_ + auVar42._28_4_ + -1.0 + auVar43._28_4_;
      goto LAB_002fdcb3;
    case 6:
      fVar76 = *activation_params->data;
      fVar77 = *(float *)((long)activation_params->data + 4);
      auVar43._0_4_ = fVar76 * fVar102 + fVar77;
      auVar43._4_4_ = fVar76 * fVar103 + fVar77;
      auVar43._8_4_ = fVar76 * auVar22._8_4_ + fVar77;
      auVar43._12_4_ = fVar76 * auVar22._12_4_ + fVar77;
      auVar43._16_4_ = fVar76 * auVar22._16_4_ + fVar77;
      auVar43._20_4_ = fVar76 * auVar22._20_4_ + fVar77;
      auVar43._24_4_ = fVar76 * auVar22._24_4_ + fVar77;
      auVar43._28_4_ = fVar76 + fVar77;
      auVar42 = vmaxps_avx(auVar43,auVar16);
      auVar16 = vminps_avx(auVar42,auVar70);
LAB_002fdcb3:
      auVar42._4_4_ = auVar16._4_4_ * fVar103;
      auVar42._0_4_ = auVar16._0_4_ * fVar102;
      auVar42._8_4_ = auVar16._8_4_ * auVar22._8_4_;
      auVar42._12_4_ = auVar16._12_4_ * auVar22._12_4_;
      auVar42._16_4_ = auVar16._16_4_ * auVar22._16_4_;
      auVar42._20_4_ = auVar16._20_4_ * auVar22._20_4_;
      auVar42._24_4_ = auVar16._24_4_ * auVar22._24_4_;
      auVar42._28_4_ = (float)auVar16._28_4_;
    }
switchD_002fd811_caseD_1:
    *(undefined1 (*) [32])((long)top_blob->data + uVar12 * 0x20) = auVar42;
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

void innerproduct_fp16s_pack8_avx_f16c(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_fp16, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
    innerproduct_fp16s_pack8_avx(bottom_blob, top_blob, weight_data_fp16, bias_data, activation_type, activation_params, opt);
}